

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cpp
# Opt level: O3

void __thiscall lsh::table::table(table *this,brute *c)

{
  uint uVar1;
  allocator_type local_7a;
  bool local_79;
  undefined1 local_78 [40];
  size_t local_50;
  __node_base_ptr p_Stack_48;
  vector local_40;
  
  (this->vectors_)._M_h._M_buckets = &(this->vectors_)._M_h._M_single_bucket;
  (this->vectors_)._M_h._M_bucket_count = 1;
  (this->vectors_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->vectors_)._M_h._M_element_count = 0;
  (this->vectors_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->vectors_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->vectors_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->masks_).super__Vector_base<lsh::vector,_std::allocator<lsh::vector>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->masks_).super__Vector_base<lsh::vector,_std::allocator<lsh::vector>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->masks_).super__Vector_base<lsh::vector,_std::allocator<lsh::vector>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->partitions_).
  super__Vector_base<std::unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>,_std::allocator<std::unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->partitions_).
  super__Vector_base<std::unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>,_std::allocator<std::unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->partitions_).
  super__Vector_base<std::unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>,_std::allocator<std::unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar1 = c->dimensions;
  this->dimensions_ = uVar1;
  local_79 = false;
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_78,(ulong)uVar1,&local_79,&local_7a);
  vector::vector(&local_40,(vector<bool,_std::allocator<bool>_> *)local_78);
  std::vector<lsh::vector,_std::allocator<lsh::vector>_>::emplace_back<lsh::vector>
            (&this->masks_,&local_40);
  if (local_40.components_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.components_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((__buckets_ptr)local_78._0_8_ != (__buckets_ptr)0x0) {
    operator_delete((void *)local_78._0_8_);
  }
  local_78._0_8_ = &p_Stack_48;
  local_78._8_8_ = 1;
  local_78._16_8_ = (_Hash_node_base *)0x0;
  local_78._24_8_ = 0;
  local_78._32_8_ = (_Bit_pointer)0x3f800000;
  local_50 = 0;
  p_Stack_48 = (__node_base_ptr)0x0;
  std::
  vector<std::unordered_map<unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>>>>,std::allocator<std::unordered_map<unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>>>>>>
  ::
  emplace_back<std::unordered_map<unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>>>>>
            ((vector<std::unordered_map<unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>>>>,std::allocator<std::unordered_map<unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>>>>>>
              *)&this->partitions_,
             (unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
              *)local_78);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_78);
  return;
}

Assistant:

table::table(const brute& c) {
    unsigned int d = c.dimensions;

    this->dimensions_ = d;
    this->masks_.push_back(vector(std::vector<bool>(d)));
    this->partitions_.push_back(partition());
  }